

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O0

void g2d_polygon_closest_boundary_point(zarray_t *poly,double *q,double *p)

{
  double dVar1;
  double dist;
  double thisp [2];
  g2d_line_segment_t seg;
  double *p1;
  double *p0;
  double dStack_30;
  int i;
  double min_dist;
  double *pdStack_20;
  int psz;
  double *p_local;
  double *q_local;
  zarray_t *poly_local;
  
  pdStack_20 = p;
  p_local = q;
  q_local = (double *)poly;
  min_dist._4_4_ = zarray_size(poly);
  dStack_30 = INFINITY;
  for (p0._4_4_ = 0; p0._4_4_ < min_dist._4_4_; p0._4_4_ = p0._4_4_ + 1) {
    zarray_get_volatile((zarray_t *)q_local,p0._4_4_,&p1);
    zarray_get_volatile((zarray_t *)q_local,(p0._4_4_ + 1) % min_dist._4_4_,seg.p1 + 1);
    g2d_line_segment_init_from_points((g2d_line_segment_t *)(thisp + 1),p1,(double *)seg.p1[1]);
    g2d_line_segment_closest_point((g2d_line_segment_t *)(thisp + 1),p_local,&dist);
    dVar1 = g2d_distance(p_local,&dist);
    if (dVar1 < dStack_30) {
      *pdStack_20 = dist;
      pdStack_20[1] = thisp[0];
      dStack_30 = dVar1;
    }
  }
  return;
}

Assistant:

void g2d_polygon_closest_boundary_point(const zarray_t *poly, const double q[2], double *p)
{
    int psz = zarray_size(poly);
    double min_dist = HUGE_VALF;

    for (int i = 0; i < psz; i++) {
        double *p0, *p1;

        zarray_get_volatile(poly, i, &p0);
        zarray_get_volatile(poly, (i+1) % psz, &p1);

        g2d_line_segment_t seg;
        g2d_line_segment_init_from_points(&seg, p0, p1);

        double thisp[2];
        g2d_line_segment_closest_point(&seg, q, thisp);

        double dist = g2d_distance(q, thisp);
        if (dist < min_dist) {
            memcpy(p, thisp, sizeof(double[2]));
            min_dist = dist;
        }
    }
}